

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

LayoutBindingTestResult * __thiscall
glcts::AtomicCounterLayoutBindingCase::binding_examples_one_binding
          (LayoutBindingTestResult *__return_storage_ptr__,AtomicCounterLayoutBindingCase *this)

{
  key_type *pkVar1;
  size_type *psVar2;
  pointer pbVar3;
  char *pcVar4;
  _func_int **pp_Var5;
  bool bVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  undefined4 extraout_var;
  mapped_type_conflict *pmVar11;
  undefined4 extraout_var_00;
  ulong uVar12;
  long *plVar13;
  undefined8 *puVar14;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined8 uVar15;
  pointer pbVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  byte bVar20;
  StringIntMap offsets;
  StringVector list;
  StringVector list_1;
  IntVector expected;
  StringStream s;
  undefined1 local_330 [48];
  String local_300;
  LayoutBindingTestResult *local_2e0;
  uint local_2d4;
  LayoutBindingProgram *local_2d0;
  IProgramContextSupplier *local_2c8;
  code *local_2c0;
  undefined1 local_2b8 [24];
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  undefined8 local_288;
  String local_278;
  vector<int,_std::allocator<int>_> local_258;
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  pointer *local_218;
  long local_210;
  pointer local_208 [2];
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8 [2];
  undefined1 local_1d8 [112];
  undefined **local_168 [27];
  undefined8 local_90;
  undefined2 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  LayoutBindingProgram *pLVar10;
  
  local_2e0 = __return_storage_ptr__;
  std::ios_base::ios_base((ios_base *)local_168);
  local_2c0 = glUniformMatrix3x2fv;
  local_168[0] = (undefined **)glUniformMatrix3x2fv;
  local_90 = 0;
  local_88 = 0;
  local_80 = 0;
  uStack_78 = 0;
  local_70 = 0;
  uStack_68 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
  local_1d8._0_8_ = &PTR__StringStream_02143dd0;
  local_168[0] = &PTR__StringStream_02143df8;
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(&local_300,this,0);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x1b])(local_330,this,&local_300);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
  pcVar4 = local_330 + 0x10;
  if ((char *)local_330._0_8_ != pcVar4) {
    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
      &local_300.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
                    local_300.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  LayoutBindingBaseCase::setTemplateParam
            (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type,
             "UNIFORM_ACCESS",(String *)local_330);
  if ((char *)local_330._0_8_ != pcVar4) {
    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
  }
  StringStream::reset((StringStream *)local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d8,"layout(binding=0, offset=4) uniform atomic_uint;\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d8,"layout(binding=0) uniform atomic_uint ",0x26);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(local_330,this,0);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
  if ((char *)local_330._0_8_ != pcVar4) {
    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
  }
  std::__cxx11::stringbuf::str();
  LayoutBindingBaseCase::setTemplateParam
            (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type,
             "UNIFORM_DECL",(String *)local_330);
  if ((char *)local_330._0_8_ != pcVar4) {
    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
  }
  LayoutBindingBaseCase::updateTemplate
            (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type);
  local_2c8 = &(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier;
  iVar7 = (*(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier.
            _vptr_IProgramContextSupplier[6])();
  pLVar10 = (LayoutBindingProgram *)CONCAT44(extraout_var,iVar7);
  bVar6 = LayoutBindingProgram::compiledAndLinked(pLVar10);
  if (bVar6) {
    local_2b8._0_8_ = (key_type *)0x0;
    local_2b8._8_8_ = (pointer)0x0;
    local_2b8._16_8_ = (pointer)0x0;
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_330,this,0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_2b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330);
    if ((char *)local_330._0_8_ != pcVar4) {
      operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2b8);
    (*pLVar10->_vptr_LayoutBindingProgram[5])(local_330,pLVar10,&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            *)local_330,(key_type *)local_2b8._0_8_);
    iVar7 = *pmVar11;
    if (iVar7 != 4) {
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_278,"offset did not match requested","");
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              *)local_330,(key_type *)local_2b8._0_8_);
      LayoutBindingBaseCase::generateLog<int,int>
                (&local_300,&this->super_LayoutBindingBaseCase,&local_278,*pmVar11,1);
      local_2e0->m_passed = false;
      local_2e0->m_notRunForThisContext = false;
      (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2e0->m_reason,
                 CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
                 local_300._M_string_length +
                 CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
          &local_300.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
                        local_300.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *)local_330);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2b8);
    (*pLVar10->_vptr_LayoutBindingProgram[1])(pLVar10);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
    std::ios_base::~ios_base((ios_base *)local_168);
    if (iVar7 != 4) {
      return local_2e0;
    }
    std::ios_base::ios_base((ios_base *)local_168);
    local_168[0] = (undefined **)local_2c0;
    local_90 = 0;
    local_88 = 0;
    local_80 = 0;
    uStack_78 = 0;
    local_70 = 0;
    uStack_68 = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
    local_1d8._0_8_ = &PTR__StringStream_02143dd0;
    local_168[0] = &PTR__StringStream_02143df8;
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(&local_300,this,0);
    pcVar4 = local_330 + 0x10;
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1b])(local_330,this,&local_300);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
    if ((char *)local_330._0_8_ != pcVar4) {
      operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
        &local_300.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
                      local_300.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(&local_300,this,1);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1b])(local_330,this,&local_300);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
    if ((char *)local_330._0_8_ != pcVar4) {
      operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
        &local_300.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
                      local_300.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(&local_300,this,2);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1b])(local_330,this,&local_300);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
    if ((char *)local_330._0_8_ != pcVar4) {
      operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
        &local_300.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
                      local_300.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(&local_300,this,3);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1b])(local_330,this,&local_300);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
    if ((char *)local_330._0_8_ != pcVar4) {
      operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
        &local_300.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
                      local_300.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    LayoutBindingBaseCase::setTemplateParam
              (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type,
               "UNIFORM_ACCESS",(String *)local_330);
    if ((char *)local_330._0_8_ != pcVar4) {
      operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
    }
    StringStream::reset((StringStream *)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"layout(binding=0, offset=4) uniform atomic_uint ",0x30);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_330,this,0);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
    if ((char *)local_330._0_8_ != pcVar4) {
      operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"layout(binding=0) uniform atomic_uint ",0x26);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_330,this,1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
    if ((char *)local_330._0_8_ != pcVar4) {
      operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"layout(binding=0) uniform atomic_uint ",0x26);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_330,this,2);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
    if ((char *)local_330._0_8_ != pcVar4) {
      operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"layout(binding=0) uniform atomic_uint ",0x26);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_330,this,3);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
    if ((char *)local_330._0_8_ != pcVar4) {
      operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
    }
    std::__cxx11::stringbuf::str();
    LayoutBindingBaseCase::setTemplateParam
              (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type,
               "UNIFORM_DECL",(String *)local_330);
    if ((char *)local_330._0_8_ != pcVar4) {
      operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
    }
    LayoutBindingBaseCase::updateTemplate
              (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type);
    iVar7 = (*local_2c8->_vptr_IProgramContextSupplier[6])();
    pLVar10 = (LayoutBindingProgram *)CONCAT44(extraout_var_00,iVar7);
    bVar6 = LayoutBindingProgram::compiledAndLinked(pLVar10);
    if (bVar6) {
      local_298._M_allocated_capacity = 0;
      local_298._8_8_ = 0;
      local_288 = 0;
      local_2d0 = pLVar10;
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(local_330,this,0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 local_298._M_local_buf,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330);
      if ((char *)local_330._0_8_ != pcVar4) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(local_330,this,1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 local_298._M_local_buf,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330);
      if ((char *)local_330._0_8_ != pcVar4) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(local_330,this,2);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 local_298._M_local_buf,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330);
      if ((char *)local_330._0_8_ != pcVar4) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(local_330,this,3);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 local_298._M_local_buf,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330);
      if ((char *)local_330._0_8_ != pcVar4) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_60,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_298);
      (*pLVar10->_vptr_LayoutBindingProgram[5])(local_330,pLVar10,&local_60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_60);
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_300._M_dataplus._M_p._0_4_ = 4;
      std::vector<int,_std::allocator<int>_>::_M_insert_rval
                (&local_258,(const_iterator)0x0,(value_type_conflict1 *)&local_300);
      local_300._M_dataplus._M_p._0_4_ = 8;
      std::vector<int,_std::allocator<int>_>::_M_insert_rval
                (&local_258,
                 (const_iterator)
                 local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(value_type_conflict1 *)&local_300);
      local_300._M_dataplus._M_p._0_4_ = 0xc;
      std::vector<int,_std::allocator<int>_>::_M_insert_rval
                (&local_258,
                 (const_iterator)
                 local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(value_type_conflict1 *)&local_300);
      local_300._M_dataplus._M_p._0_4_ = 0x10;
      std::vector<int,_std::allocator<int>_>::_M_insert_rval
                (&local_258,
                 (const_iterator)
                 local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(value_type_conflict1 *)&local_300);
      bVar20 = local_298._8_8_ == local_298._M_allocated_capacity;
      if (!(bool)bVar20) {
        uVar17 = 1;
        uVar18 = 0;
        do {
          local_2d4 = CONCAT31(local_2d4._1_3_,bVar20);
          iVar7 = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar18];
          lVar19 = uVar18 * 0x20;
          pmVar11 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                  *)local_330,(key_type *)(local_298._M_allocated_capacity + lVar19)
                                );
          if ((bVar6 & iVar7 == *pmVar11) == 0) {
            local_238 = local_228;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"offset of","");
            local_1f8 = local_1e8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1f8,*(long *)(local_298._M_allocated_capacity + lVar19),
                       *(long *)(local_298._M_allocated_capacity + 8 + uVar18 * 0x20) +
                       *(long *)(local_298._M_allocated_capacity + lVar19));
            uVar12 = 0xf;
            if (local_238 != local_228) {
              uVar12 = local_228[0];
            }
            if (uVar12 < (ulong)(local_1f0 + local_230)) {
              uVar12 = 0xf;
              if (local_1f8 != local_1e8) {
                uVar12 = local_1e8[0];
              }
              if (uVar12 < (ulong)(local_1f0 + local_230)) goto LAB_00bf1292;
              plVar13 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_1f8,0,(char *)0x0,(ulong)local_238);
            }
            else {
LAB_00bf1292:
              plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_1f8)
              ;
            }
            local_2b8._0_8_ = local_2b8 + 0x10;
            pkVar1 = (key_type *)(plVar13 + 2);
            if ((key_type *)*plVar13 == pkVar1) {
              local_2b8._16_8_ = (pkVar1->_M_dataplus)._M_p;
              uStack_2a0 = (undefined4)plVar13[3];
              uStack_29c = *(undefined4 *)((long)plVar13 + 0x1c);
            }
            else {
              local_2b8._16_8_ = (pkVar1->_M_dataplus)._M_p;
              local_2b8._0_8_ = (key_type *)*plVar13;
            }
            local_2b8._8_8_ = plVar13[1];
            *plVar13 = (long)pkVar1;
            plVar13[1] = 0;
            *(undefined1 *)&(pkVar1->_M_dataplus)._M_p = 0;
            local_218 = local_208;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_218,"did not match requested","");
            pbVar3 = (pointer)((long)&((_Alloc_hider *)local_2b8._8_8_)->_M_p + local_210);
            pbVar16 = (pointer)0xf;
            if ((key_type *)local_2b8._0_8_ != (key_type *)(local_2b8 + 0x10)) {
              pbVar16 = (pointer)local_2b8._16_8_;
            }
            if (pbVar16 < pbVar3) {
              pbVar16 = (pointer)0xf;
              if (local_218 != local_208) {
                pbVar16 = local_208[0];
              }
              if (pbVar16 < pbVar3) goto LAB_00bf1383;
              puVar14 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_218,0,(char *)0x0,local_2b8._0_8_);
            }
            else {
LAB_00bf1383:
              puVar14 = (undefined8 *)std::__cxx11::string::_M_append(local_2b8,(ulong)local_218);
            }
            local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
            psVar2 = puVar14 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar14 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar2) {
              local_278.field_2._M_allocated_capacity = *psVar2;
              local_278.field_2._8_8_ = puVar14[3];
            }
            else {
              local_278.field_2._M_allocated_capacity = *psVar2;
              local_278._M_dataplus._M_p = (pointer)*puVar14;
            }
            local_278._M_string_length = puVar14[1];
            *puVar14 = psVar2;
            puVar14[1] = 0;
            *(undefined1 *)psVar2 = 0;
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                    *)local_330,
                                   (key_type *)(lVar19 + local_298._M_allocated_capacity));
            LayoutBindingBaseCase::generateLog<int,int>
                      (&local_300,&this->super_LayoutBindingBaseCase,&local_278,*pmVar11,
                       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar18]);
            local_2e0->m_passed = false;
            local_2e0->m_notRunForThisContext = false;
            (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2e0->m_reason,
                       CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
                       local_300._M_string_length +
                       CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
                &local_300.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_300._M_dataplus._M_p._4_4_,
                                       local_300._M_dataplus._M_p._0_4_),
                              local_300.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_218 != local_208) {
              operator_delete(local_218,(ulong)((long)&(local_208[0]->_M_dataplus)._M_p + 1));
            }
            if ((key_type *)local_2b8._0_8_ != (key_type *)(local_2b8 + 0x10)) {
              operator_delete((void *)local_2b8._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_2b8._16_8_)->_M_p + 1));
            }
            bVar20 = (byte)local_2d4;
            if (local_1f8 != local_1e8) {
              operator_delete(local_1f8,local_1e8[0] + 1);
            }
            if (local_238 != local_228) {
              operator_delete(local_238,local_228[0] + 1);
            }
            break;
          }
          uVar18 = (ulong)uVar17;
          uVar12 = (long)(local_298._8_8_ - local_298._0_8_) >> 5;
          uVar17 = uVar17 + 1;
          bVar6 = true;
          bVar20 = uVar12 <= uVar18;
        } while (uVar18 < uVar12);
      }
      if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)local_330);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_298);
      (*local_2d0->_vptr_LayoutBindingProgram[1])();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
      std::ios_base::~ios_base((ios_base *)local_168);
      if ((bVar20 & 1) == 0) {
        return local_2e0;
      }
      std::ios_base::ios_base((ios_base *)local_168);
      local_168[0] = (undefined **)local_2c0;
      local_90 = 0;
      local_88 = 0;
      local_80 = 0;
      uStack_78 = 0;
      local_70 = 0;
      uStack_68 = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      local_1d8._0_8_ = &PTR__StringStream_02143dd0;
      local_168[0] = &PTR__StringStream_02143df8;
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(&local_300,this,0);
      pcVar4 = local_330 + 0x10;
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x1b])(local_330,this,&local_300);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
      if ((char *)local_330._0_8_ != pcVar4) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
          &local_300.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
                        local_300.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      LayoutBindingBaseCase::setTemplateParam
                (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type
                 ,"UNIFORM_ACCESS",(String *)local_330);
      if ((char *)local_330._0_8_ != pcVar4) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      StringStream::reset((StringStream *)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"layout(binding=0, offset=4) uniform atomic_uint;\n",0x31);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"layout(offset=8) uniform atomic_uint ",0x25);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(local_330,this,0);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
      if ((char *)local_330._0_8_ != pcVar4) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      std::__cxx11::stringbuf::str();
      LayoutBindingBaseCase::setTemplateParam
                (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type
                 ,"UNIFORM_DECL",(String *)local_330);
      if ((char *)local_330._0_8_ != pcVar4) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      LayoutBindingBaseCase::updateTemplate
                (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type
                );
      iVar7 = (*local_2c8->_vptr_IProgramContextSupplier[6])();
      pLVar10 = (LayoutBindingProgram *)CONCAT44(extraout_var_01,iVar7);
      bVar6 = LayoutBindingProgram::compiledAndLinked(pLVar10);
      if (bVar6) {
        local_330._0_8_ = pcVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"should not compile","")
        ;
        local_2e0->m_passed = false;
        local_2e0->m_notRunForThisContext = false;
        (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0->m_reason,local_330._0_8_,
                   (char *)(local_330._0_8_ + local_330._8_8_));
        if ((char *)local_330._0_8_ != pcVar4) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        (*pLVar10->_vptr_LayoutBindingProgram[1])(pLVar10);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        std::ios_base::~ios_base((ios_base *)local_168);
        if (bVar6) {
          return local_2e0;
        }
      }
      else {
        (*pLVar10->_vptr_LayoutBindingProgram[1])(pLVar10);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        std::ios_base::~ios_base((ios_base *)local_168);
      }
      std::ios_base::ios_base((ios_base *)local_168);
      local_168[0] = (undefined **)local_2c0;
      local_90 = 0;
      local_88 = 0;
      local_80 = 0;
      uStack_78 = 0;
      local_70 = 0;
      uStack_68 = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      local_1d8._0_8_ = &PTR__StringStream_02143dd0;
      local_168[0] = &PTR__StringStream_02143df8;
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(&local_300,this,0);
      pcVar4 = local_330 + 0x10;
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x1b])(local_330,this,&local_300);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
      if ((char *)local_330._0_8_ != pcVar4) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
          &local_300.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
                        local_300.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      LayoutBindingBaseCase::setTemplateParam
                (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type
                 ,"UNIFORM_ACCESS",(String *)local_330);
      if ((char *)local_330._0_8_ != pcVar4) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      StringStream::reset((StringStream *)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"layout(offset=4) uniform atomic_uint ",0x25);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(local_330,this,0);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
      if ((char *)local_330._0_8_ != pcVar4) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      std::__cxx11::stringbuf::str();
      LayoutBindingBaseCase::setTemplateParam
                (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type
                 ,"UNIFORM_DECL",(String *)local_330);
      if ((char *)local_330._0_8_ != pcVar4) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      LayoutBindingBaseCase::updateTemplate
                (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type
                );
      iVar7 = (*local_2c8->_vptr_IProgramContextSupplier[6])();
      pLVar10 = (LayoutBindingProgram *)CONCAT44(extraout_var_02,iVar7);
      bVar6 = LayoutBindingProgram::compiledAndLinked(pLVar10);
      if (bVar6) {
        local_330._0_8_ = pcVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"should not compile","")
        ;
        local_2e0->m_passed = false;
        local_2e0->m_notRunForThisContext = false;
        (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0->m_reason,local_330._0_8_,
                   (char *)(local_330._0_8_ + local_330._8_8_));
        if ((char *)local_330._0_8_ != pcVar4) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        (*pLVar10->_vptr_LayoutBindingProgram[1])(pLVar10);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        std::ios_base::~ios_base((ios_base *)local_168);
        if (bVar6) {
          return local_2e0;
        }
      }
      else {
        (*pLVar10->_vptr_LayoutBindingProgram[1])(pLVar10);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        std::ios_base::~ios_base((ios_base *)local_168);
      }
      iVar7 = 1;
      uVar15 = 0;
      do {
        local_2d4 = (uint)uVar15;
        std::ios_base::ios_base((ios_base *)local_168);
        local_168[0] = (undefined **)local_2c0;
        local_90 = 0;
        local_88 = 0;
        local_70 = 0;
        uStack_68 = 0;
        local_80 = 0;
        uStack_78 = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        local_1d8._0_8_ = &PTR__StringStream_02143dd0;
        local_168[0] = &PTR__StringStream_02143df8;
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(&local_300,this,0);
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x1b])((String *)local_330,this,&local_300);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
        if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
            &local_300.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_
                                  ),local_300.field_2._M_allocated_capacity + 1);
        }
        if (iVar7 != 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
          (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x17])(&local_300,this,1);
          (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x1b])((String *)local_330,this,&local_300);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
          if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
            operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
              &local_300.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_300._M_dataplus._M_p._4_4_,
                                     local_300._M_dataplus._M_p._0_4_),
                            local_300.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::stringbuf::str();
        LayoutBindingBaseCase::setTemplateParam
                  (&this->super_LayoutBindingBaseCase,
                   (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_ACCESS",
                   (String *)local_330);
        if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        StringStream::reset((StringStream *)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"layout(binding=0, offset=0) uniform atomic_uint ",0x30);
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])((String *)local_330,this,0);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
        if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        if (iVar7 != 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d8,"layout(binding=0, offset=0) uniform atomic_uint ",0x30);
          (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x17])((String *)local_330,this,1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
          if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
            operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
          }
        }
        std::__cxx11::stringbuf::str();
        LayoutBindingBaseCase::setTemplateParam
                  (&this->super_LayoutBindingBaseCase,
                   (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_DECL",
                   (String *)local_330);
        if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        LayoutBindingBaseCase::updateTemplate
                  (&this->super_LayoutBindingBaseCase,
                   (this->super_LayoutBindingBaseCase).m_stage.type);
        iVar8 = (*local_2c8->_vptr_IProgramContextSupplier[6])();
        pLVar10 = (LayoutBindingProgram *)CONCAT44(extraout_var_03,iVar8);
        bVar6 = LayoutBindingProgram::compiledAndLinked(pLVar10);
        if (iVar7 == 1) {
          if (!bVar6) {
            local_330._0_8_ = local_330 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_330,"should not compile","");
            local_2e0->m_passed = false;
            local_2e0->m_notRunForThisContext = false;
            (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2e0->m_reason,local_330._0_8_,
                       (char *)(local_330._0_8_ + local_330._8_8_));
LAB_00bf1f75:
            if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
              operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
            }
            (*pLVar10->_vptr_LayoutBindingProgram[1])(pLVar10);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
            std::ios_base::~ios_base((ios_base *)local_168);
            if ((local_2d4 & 1) == 0) {
              return local_2e0;
            }
            break;
          }
        }
        else if (bVar6) {
          LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)local_330,pLVar10,false);
          local_2e0->m_passed = true;
          local_2e0->m_notRunForThisContext = false;
          (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2e0->m_reason,local_330._0_8_,
                     (char *)(local_330._0_8_ + local_330._8_8_));
          goto LAB_00bf1f75;
        }
        (*pLVar10->_vptr_LayoutBindingProgram[1])(pLVar10);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        uVar15 = std::ios_base::~ios_base((ios_base *)local_168);
        iVar7 = iVar7 + -1;
        uVar15 = CONCAT71((int7)((ulong)uVar15 >> 8),iVar7 != 0);
      } while (iVar7 == 0);
      iVar7 = 1;
      uVar15 = 0;
      do {
        local_2d4 = (uint)uVar15;
        std::ios_base::ios_base((ios_base *)local_168);
        local_168[0] = (undefined **)local_2c0;
        local_90 = 0;
        local_88 = 0;
        local_70 = 0;
        uStack_68 = 0;
        local_80 = 0;
        uStack_78 = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        local_1d8._0_8_ = &PTR__StringStream_02143dd0;
        local_168[0] = &PTR__StringStream_02143df8;
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(&local_300,this,0);
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x1b])((String *)local_330,this,&local_300);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
        if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
            &local_300.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_
                                  ),local_300.field_2._M_allocated_capacity + 1);
        }
        if (iVar7 != 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
          (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x17])(&local_300,this,1);
          (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x1b])((String *)local_330,this,&local_300);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
          if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
            operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
              &local_300.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_300._M_dataplus._M_p._4_4_,
                                     local_300._M_dataplus._M_p._0_4_),
                            local_300.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::stringbuf::str();
        LayoutBindingBaseCase::setTemplateParam
                  (&this->super_LayoutBindingBaseCase,
                   (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_ACCESS",
                   (String *)local_330);
        if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        StringStream::reset((StringStream *)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"layout(binding=0, offset=0) uniform atomic_uint ",0x30);
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])((String *)local_330,this,0);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
        if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        if (iVar7 != 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d8,"layout(binding=0, offset=2) uniform atomic_uint ",0x30);
          (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x17])((String *)local_330,this,1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
          if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
            operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
          }
        }
        std::__cxx11::stringbuf::str();
        LayoutBindingBaseCase::setTemplateParam
                  (&this->super_LayoutBindingBaseCase,
                   (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_DECL",
                   (String *)local_330);
        if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        LayoutBindingBaseCase::updateTemplate
                  (&this->super_LayoutBindingBaseCase,
                   (this->super_LayoutBindingBaseCase).m_stage.type);
        iVar8 = (*local_2c8->_vptr_IProgramContextSupplier[6])();
        pLVar10 = (LayoutBindingProgram *)CONCAT44(extraout_var_04,iVar8);
        bVar6 = LayoutBindingProgram::compiledAndLinked(pLVar10);
        if (iVar7 == 1) {
          if (!bVar6) {
            local_330._0_8_ = local_330 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_330,"should not compile","");
            local_2e0->m_passed = false;
            local_2e0->m_notRunForThisContext = false;
            (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2e0->m_reason,local_330._0_8_,
                       (char *)(local_330._0_8_ + local_330._8_8_));
LAB_00bf23d5:
            if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
              operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
            }
            (*pLVar10->_vptr_LayoutBindingProgram[1])(pLVar10);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
            std::ios_base::~ios_base((ios_base *)local_168);
            if ((local_2d4 & 1) == 0) {
              return local_2e0;
            }
            break;
          }
        }
        else if (bVar6) {
          LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)local_330,pLVar10,false);
          local_2e0->m_passed = true;
          local_2e0->m_notRunForThisContext = false;
          (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2e0->m_reason,local_330._0_8_,
                     (char *)(local_330._0_8_ + local_330._8_8_));
          goto LAB_00bf23d5;
        }
        (*pLVar10->_vptr_LayoutBindingProgram[1])(pLVar10);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        uVar15 = std::ios_base::~ios_base((ios_base *)local_168);
        iVar7 = iVar7 + -1;
        uVar15 = CONCAT71((int7)((ulong)uVar15 >> 8),iVar7 != 0);
      } while (iVar7 == 0);
      pp_Var5 = (_func_int **)(local_1d8 + 0x10);
      local_1d8._8_8_ = 0;
      local_1d8[0x10] = 0;
      local_2e0->m_passed = true;
      local_2e0->m_notRunForThisContext = false;
      (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
      local_1d8._0_8_ = pp_Var5;
      std::__cxx11::string::_M_construct<char*>((string *)&local_2e0->m_reason,pp_Var5,pp_Var5);
      if ((_func_int **)local_1d8._0_8_ == pp_Var5) {
        return local_2e0;
      }
      operator_delete((void *)local_1d8._0_8_,CONCAT71(local_1d8._17_7_,local_1d8[0x10]) + 1);
      return local_2e0;
    }
    LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)local_330,pLVar10,false);
    local_2e0->m_passed = false;
    local_2e0->m_notRunForThisContext = false;
    (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0->m_reason,local_330._0_8_,
               (char *)(local_330._0_8_ + local_330._8_8_));
    if ((char *)local_330._0_8_ == pcVar4) goto LAB_00bf1168;
  }
  else {
    LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)local_330,pLVar10,false);
    local_2e0->m_passed = false;
    local_2e0->m_notRunForThisContext = false;
    (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0->m_reason,local_330._0_8_,
               (char *)(local_330._0_8_ + local_330._8_8_));
    if ((char *)local_330._0_8_ == pcVar4) goto LAB_00bf1168;
  }
  operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
LAB_00bf1168:
  (*pLVar10->_vptr_LayoutBindingProgram[1])(pLVar10);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
  std::ios_base::~ios_base((ios_base *)local_168);
  return local_2e0;
}

Assistant:

LayoutBindingTestResult binding_examples_one_binding(void)
	{
		// example 1 in atomic counter CTS spec ac-binding-examples
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=0, offset=4) uniform atomic_uint;\n";
			s << "layout(binding=0) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (!passed)
			{
				return LayoutBindingTestResult(passed, program->getErrorLog());
			}

			StringVector list;
			list.push_back(getDefaultUniformName());

			StringIntMap offsets = program->getOffsets(list);
			passed &= (4 == offsets[list[0]]);
			if (!passed)
			{
				return LayoutBindingTestResult(
					passed, generateLog(String("offset did not match requested"), offsets[list[0]], 1));
			}
		}

		// example 2 in atomic counter CTS spec ac-binding-examples
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			s << "+" << buildAccess(getDefaultUniformName(1)) << ";\n";
			s << "+" << buildAccess(getDefaultUniformName(2)) << ";\n";
			s << "+" << buildAccess(getDefaultUniformName(3)) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=0, offset=4) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			s << "layout(binding=0) uniform atomic_uint " << getDefaultUniformName(1) << ";\n";
			s << "layout(binding=0) uniform atomic_uint " << getDefaultUniformName(2) << ";\n";
			s << "layout(binding=0) uniform atomic_uint " << getDefaultUniformName(3) << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (!passed)
			{
				return LayoutBindingTestResult(passed, program->getErrorLog());
			}

			StringVector list;
			list.push_back(getDefaultUniformName());
			list.push_back(getDefaultUniformName(1));
			list.push_back(getDefaultUniformName(2));
			list.push_back(getDefaultUniformName(3));

			StringIntMap offsets = program->getOffsets(list);
			IntVector	expected;
			expected.insert(expected.end(), 4);
			expected.insert(expected.end(), 8);
			expected.insert(expected.end(), 12);
			expected.insert(expected.end(), 16);
			for (unsigned int idx = 0; idx < list.size(); idx++)
			{
				passed &= (expected[idx] == offsets[list[idx]]);
				if (!passed)
				{
					return LayoutBindingTestResult(
						passed, generateLog(String("offset of") + String(list[idx]) + String("did not match requested"),
											offsets[list[idx]], expected[idx]));
				}
			}
		}

		// example 3 in atomic counter CTS spec ac-binding-examples
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=0, offset=4) uniform atomic_uint;\n";
			s << "layout(offset=8) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (passed)
			{
				return LayoutBindingTestResult(!passed, String("should not compile"));
			}
		}

		// example 4 in atomic counter CTS spec ac-binding-examples
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(offset=4) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (passed)
			{
				return LayoutBindingTestResult(!passed, String("should not compile"));
			}
		}

		// example 5 in atomic counter CTS spec ac-binding-examples
		// first check working example, then amend it with an error
		for (int pass = 0; pass < 2; pass++)
		{
			bool passed = true;

			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			if (pass)
				s << "+" << buildAccess(getDefaultUniformName(1)) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=0, offset=0) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			if (pass)
				s << "layout(binding=0, offset=0) uniform atomic_uint " << getDefaultUniformName(1) << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (pass != 0)
			{
				if (passed)
				{
					return LayoutBindingTestResult(passed, program->getErrorLog());
				}
			}
			else
			{
				if (!passed)
				{
					return LayoutBindingTestResult(passed, String("should not compile"));
				}
			}
		}

		// example 6 in atomic counter CTS spec ac-binding-examples
		// first check working example, then amend it with an error
		for (int pass = 0; pass < 2; pass++)
		{
			bool passed = true;

			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			if (pass)
				s << "+" << buildAccess(getDefaultUniformName(1)) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=0, offset=0) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			if (pass)
				s << "layout(binding=0, offset=2) uniform atomic_uint " << getDefaultUniformName(1) << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (pass != 0)
			{
				if (passed)
				{
					return LayoutBindingTestResult(passed, program->getErrorLog());
				}
			}
			else
			{
				if (!passed)
				{
					return LayoutBindingTestResult(passed, String("should not compile"));
				}
			}
		}

		return true;
	}